

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minion.c
# Opt level: O0

int dlord(aligntyp atyp)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int local_14;
  int pm;
  int tryct;
  aligntyp atyp_local;
  
  local_14 = 0;
  do {
    if (0x13 < local_14) {
      iVar1 = ndemon(&u.uz,atyp);
      return iVar1;
    }
    iVar1 = rn2(2);
    iVar1 = iVar1 + 0x13b;
    if ((mvitals[iVar1].mvflags & 3) == 0) {
      if (atyp == -0x80) {
        return iVar1;
      }
      iVar2 = sgn((int)mons[iVar1].maligntyp);
      iVar3 = sgn((int)atyp);
      if (iVar2 == iVar3) {
        return iVar1;
      }
    }
    local_14 = local_14 + 1;
  } while( true );
}

Assistant:

int dlord(aligntyp atyp)
{
	int tryct, pm;

	for (tryct = 0; tryct < 20; tryct++) {
	    pm = rn1(PM_YEENOGHU + 1 - PM_JUIBLEX, PM_JUIBLEX);
	    if (!(mvitals[pm].mvflags & G_GONE) &&
		    (atyp == A_NONE || sgn(mons[pm].maligntyp) == sgn(atyp)))
		return pm;
	}
	return ndemon(&u.uz, atyp);	/* approximate */
}